

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall cs222::Parser::parseOperation(Parser *this,string *token,string *operation)

{
  bool bVar1;
  long *plVar2;
  undefined8 extraout_RAX;
  size_type *psVar3;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  bVar1 = isDirective(token);
  if ((bVar1) || (bVar1 = isOperation(token), bVar1)) {
    std::__cxx11::string::_M_assign((string *)operation);
    return;
  }
  if (*(token->_M_dataplus)._M_p == '+') {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)token);
    bVar1 = isOperation(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1 == false) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"not a valid directive or operation: ","");
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_70,(ulong)(token->_M_dataplus)._M_p);
    local_90._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_90._M_dataplus._M_p == psVar3) {
      local_90.field_2._M_allocated_capacity = *psVar3;
      local_90.field_2._8_8_ = plVar2[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar3;
    }
    local_90._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    throwError(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  std::__cxx11::string::_M_assign((string *)operation);
  *(byte *)&(this->flags).super__Base_bitset<1UL>._M_w =
       (byte)(this->flags).super__Base_bitset<1UL>._M_w | 1;
  return;
}

Assistant:

void Parser::parseOperation(
            const std::string& token, std::string& operation)
    {
        if (isDirective(token) || isOperation(token))
        {
            operation = token;
        }
        else if (token[0] == '+' && isOperation(token.substr(1)))
        {
            operation = token;
            flags.set(Instruction::FLAG_EXTENDED);
        }
        else
        {
            throwError(std::string("not a valid directive or operation: ") + token);
        }
    }